

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  ulong uVar1;
  float *pfVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (count == 1) {
    if (0.0 <= items->Width) {
      fVar5 = items->Width - width_excess;
      if (fVar5 <= 1.0) {
        fVar5 = 1.0;
      }
      items->Width = fVar5;
    }
  }
  else {
    ImQsort(items,(long)count,0xc,ShrinkWidthItemComparer);
    uVar1 = 1;
    for (; ((int)uVar1 < count && (0.0 < width_excess)); width_excess = width_excess - fVar6 * fVar7
        ) {
      uVar1 = (ulong)(int)uVar1;
      pfVar2 = &items[uVar1].Width;
      for (; (long)uVar1 < (long)count; uVar1 = uVar1 + 1) {
        fVar5 = items->Width;
        fVar6 = *pfVar2;
        if (fVar6 < fVar5) {
          if (fVar6 < 0.0) goto LAB_00169743;
          fVar5 = fVar5 - fVar6;
          goto LAB_0016974d;
        }
        pfVar2 = pfVar2 + 3;
      }
      fVar5 = items->Width;
LAB_00169743:
      fVar5 = fVar5 + -1.0;
LAB_0016974d:
      if (fVar5 <= 0.0) break;
      fVar7 = (float)(int)uVar1;
      fVar6 = width_excess / fVar7;
      if (fVar5 <= fVar6) {
        fVar6 = fVar5;
      }
      uVar3 = 0;
      if (0 < (int)uVar1) {
        uVar3 = uVar1 & 0xffffffff;
      }
      for (lVar4 = 0; uVar3 * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
        *(float *)((long)&items->Width + lVar4) = *(float *)((long)&items->Width + lVar4) - fVar6;
      }
    }
    uVar3 = 0;
    uVar1 = (ulong)(uint)count;
    if (count < 1) {
      uVar1 = uVar3;
    }
    fVar5 = 0.0;
    for (; uVar1 * 0xc - uVar3 != 0; uVar3 = uVar3 + 0xc) {
      fVar6 = *(float *)((long)&items->Width + uVar3);
      fVar7 = (float)(int)fVar6;
      fVar5 = fVar5 + (fVar6 - fVar7);
      *(float *)((long)&items->Width + uVar3) = fVar7;
    }
    while (0.0 < fVar5) {
      for (lVar4 = 0; uVar1 * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
        fVar6 = *(float *)((long)&items->Width + lVar4) + 1.0;
        if (fVar6 <= *(float *)((long)&items->InitialWidth + lVar4)) {
          *(float *)((long)&items->Width + lVar4) = fVar6;
          fVar5 = fVar5 + -1.0;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    while (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Width + 1.0f <= items[n].InitialWidth)
            {
                items[n].Width += 1.0f;
                width_excess -= 1.0f;
            }
}